

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O2

void __thiscall streams_tests::xor_file::test_method(xor_file *this)

{
  long lVar1;
  FILE *pFVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  string *psVar5;
  string *psVar6;
  long in_FS_OFFSET;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<std::byte> __l_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  Span<const_unsigned_char> s;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  const_string file_09;
  Span<const_unsigned_char> s_02;
  Span<const_unsigned_char> s_03;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  Span<const_unsigned_char> s_04;
  Span<const_unsigned_char> s_05;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  check_type cVar8;
  char *pcVar7;
  char *local_658;
  char *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_558 [4];
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_438 [2];
  vector<std::byte,_std::allocator<std::byte>_> read2;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_348;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_328 [3];
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  vector<std::byte,_std::allocator<std::byte>_> raw;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_168;
  vector<std::byte,_std::allocator<std::byte>_> xor_pat;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test1;
  AutoFile local_108;
  string local_e8;
  string local_c8;
  lazy_ostream local_a8;
  undefined1 *local_98;
  char *local_90;
  path local_88;
  path xor_path;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  fs::operator/(&xor_path,(path *)&local_88,"test_xor.bin");
  std::filesystem::__cxx11::path::~path(&local_88);
  local_108.m_file = (FILE *)CONCAT53(local_108.m_file._3_5_,0x30201);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_108;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&test1,__l,(allocator_type *)&local_a8);
  local_108.m_file._0_2_ = 0x504;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_108;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&test2,__l_00,(allocator_type *)&local_a8);
  local_108.m_file = (FILE *)CONCAT62(local_108.m_file._2_6_,0xff);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_108;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (&xor_pat,__l_01,(allocator_type *)&local_a8);
  pFVar2 = fsbridge::fopen((char *)&xor_path,"rb");
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&local_168,&xor_pat);
  local_108.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = local_168._M_impl.super__Vector_impl_data._M_start;
  local_108.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = local_168._M_impl.super__Vector_impl_data._M_finish;
  local_108.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_168._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_168._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.m_file = (FILE *)pFVar2;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_168);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1b;
  file.m_begin = (iterator)&local_178;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_188,msg);
  ser_writedata8<AutoFile>(&local_108,'\0');
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1b;
  file_00.m_begin = (iterator)&local_198;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a8,
             msg_00);
  local_c8._M_dataplus._M_p._0_1_ = 0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011482f0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "exception std::ios_base::failure expected but not raised";
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1b0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_c8,&local_a8,1,1,WARN,_cVar8,(size_t)&local_1b8,0x1b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_c8.field_2._M_allocated_capacity);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1c;
  file_01.m_begin = (iterator)&local_218;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_228,
             msg_01);
  ser_readdata8<AutoFile>(&local_108);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1c;
  file_02.m_begin = (iterator)&local_238;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_248,
             msg_02);
  local_c8._M_dataplus._M_p._0_1_ = 0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011482f0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "exception std::ios_base::failure expected but not raised";
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_250 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_c8,&local_a8,1,1,WARN,_cVar8,(size_t)&local_258,0x1c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_c8.field_2._M_allocated_capacity);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1d;
  file_03.m_begin = (iterator)&local_298;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2a8,
             msg_03);
  AutoFile::ignore(&local_108,1);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1d;
  file_04.m_begin = (iterator)&local_2b8;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2c8,
             msg_04);
  local_c8._M_dataplus._M_p._0_1_ = 0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011482f0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "exception std::ios_base::failure expected but not raised";
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2d0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_c8,&local_a8,1,1,WARN,_cVar8,(size_t)&local_2d8,0x1d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_c8.field_2._M_allocated_capacity);
  AutoFile::~AutoFile(&local_108);
  pFVar2 = fsbridge::fopen((char *)&xor_path,"wbx");
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)local_328,&xor_pat);
  local_108.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = local_328[0]._M_impl.super__Vector_impl_data._M_start;
  local_108.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = local_328[0]._M_impl.super__Vector_impl_data._M_finish;
  local_108.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_328[0]._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_328[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.m_file = (FILE *)pFVar2;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(local_328);
  Serialize<AutoFile,unsigned_char,std::allocator<unsigned_char>>(&local_108,&test1);
  Serialize<AutoFile,unsigned_char,std::allocator<unsigned_char>>(&local_108,&test2);
  AutoFile::~AutoFile(&local_108);
  local_108.m_file = (FILE *)fsbridge::fopen((char *)&xor_path,"rb");
  local_108.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_348._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_348);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector(&raw,7,(allocator_type *)&local_a8);
  local_a8._vptr_lazy_ostream =
       (_func_int **)
       raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
       ._M_start;
  local_a8._8_8_ =
       (long)raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  AutoFile::operator>>(&local_108,(Span<std::byte> *)&local_a8);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x2e;
  file_05.m_begin = (iterator)&local_358;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_368,
             msg_05);
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_370 = "";
  s.m_size = (long)raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
  s.m_data = raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_c8,s);
  pcVar7 = "fc01fd03fd04fa";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_c8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[15]>
            (&local_a8,&local_378,0x2e,1,2,psVar5,"HexStr(raw)","fc01fd03fd04fa",
             "\"fc01fd03fd04fa\"");
  std::__cxx11::string::~string((string *)&local_c8);
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x30;
  file_06.m_begin = (iterator)&local_388;
  msg_06.m_end = (iterator)psVar5;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_398,
             msg_06);
  AutoFile::ignore(&local_108,1);
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x30;
  file_07.m_begin = (iterator)&local_3a8;
  msg_07.m_end = (iterator)psVar5;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3b8,
             msg_07);
  local_c8._M_dataplus._M_p._0_1_ = 0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011482f0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "exception std::ios_base::failure expected but not raised";
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_3c0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_c8,&local_a8,1,1,WARN,(check_type)pcVar7,(size_t)&local_3c8,
             0x30);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_c8.field_2._M_allocated_capacity);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  AutoFile::~AutoFile(&local_108);
  pFVar2 = fsbridge::fopen((char *)&xor_path,"rb");
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)local_438,&xor_pat);
  local_108.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = local_438[0]._M_impl.super__Vector_impl_data._M_start;
  local_108.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = local_438[0]._M_impl.super__Vector_impl_data._M_finish;
  local_108.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_438[0]._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_438[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_438[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.m_file = (FILE *)pFVar2;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(local_438);
  raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  read2.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  read2.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  read2.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Unserialize<AutoFile,std::byte,std::allocator<std::byte>>(&local_108,&raw);
  Unserialize<AutoFile,std::byte,std::allocator<std::byte>>(&local_108,&read2);
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x36;
  file_08.m_begin = (iterator)&local_448;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_458,
             msg_08);
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_460 = "";
  s_00.m_size = (long)raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start;
  s_00.m_data = raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_c8,s_00);
  s_01.m_size = (long)test1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)test1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  s_01.m_data = test1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_e8,s_01);
  pvVar3 = (iterator)0x2;
  psVar5 = &local_c8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_a8,&local_468,0x36,1,2,psVar5,"HexStr(read1)",&local_e8,"HexStr(test1)");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x37;
  file_09.m_begin = (iterator)&local_478;
  msg_09.m_end = (iterator)psVar5;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_488,
             msg_09);
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_490 = "";
  s_02.m_size = (long)read2.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)read2.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start;
  s_02.m_data = read2.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_c8,s_02);
  s_03.m_size = (long)test2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)test2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  psVar5 = &local_e8;
  s_03.m_data = test2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(psVar5,s_03);
  pvVar3 = (iterator)0x2;
  psVar6 = &local_c8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_a8,&local_498,0x37,1,2,psVar6,"HexStr(read2)",psVar5,"HexStr(test2)");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x39;
  file_10.m_begin = (iterator)&local_4a8;
  msg_10.m_end = (iterator)psVar6;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_4b8,
             msg_10);
  ser_readdata8<AutoFile>(&local_108);
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x39;
  file_11.m_begin = (iterator)&local_4c8;
  msg_11.m_end = (iterator)psVar6;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_4d8,
             msg_11);
  local_c8._M_dataplus._M_p._0_1_ = 0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011482f0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "exception std::ios_base::failure expected but not raised";
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_4e0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_c8,&local_a8,1,1,WARN,(check_type)psVar5,(size_t)&local_4e8,
             0x39);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_c8.field_2._M_allocated_capacity);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&read2.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  AutoFile::~AutoFile(&local_108);
  pFVar2 = fsbridge::fopen((char *)&xor_path,"rb");
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)local_558,&xor_pat);
  local_108.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = local_558[0]._M_impl.super__Vector_impl_data._M_start;
  local_108.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = local_558[0]._M_impl.super__Vector_impl_data._M_finish;
  local_108.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_558[0]._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_558[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_558[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_558[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.m_file = (FILE *)pFVar2;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(local_558);
  raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  AutoFile::ignore(&local_108,4);
  Unserialize<AutoFile,std::byte,std::allocator<std::byte>>(&local_108,&raw);
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x41;
  file_12.m_begin = (iterator)&local_568;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_578,
             msg_12);
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_580 = "";
  s_04.m_size = (long)raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start;
  s_04.m_data = raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_c8,s_04);
  s_05.m_size = (long)test2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)test2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  psVar5 = &local_e8;
  s_05.m_data = test2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(psVar5,s_05);
  pvVar3 = (iterator)0x2;
  psVar6 = &local_c8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_a8,&local_588,0x41,1,2,psVar6,"HexStr(read2)",psVar5,"HexStr(test2)");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x43;
  file_13.m_begin = (iterator)&local_598;
  msg_13.m_end = (iterator)psVar6;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_5a8,
             msg_13);
  AutoFile::ignore(&local_108,1);
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x43;
  file_14.m_begin = (iterator)&local_5b8;
  msg_14.m_end = (iterator)psVar6;
  msg_14.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_5c8,
             msg_14);
  local_c8._M_dataplus._M_p._0_1_ = 0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011482f0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "exception std::ios_base::failure expected but not raised";
  local_5d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_5d0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_c8,&local_a8,1,1,WARN,(check_type)psVar5,(size_t)&local_5d8,
             0x43);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_c8.field_2._M_allocated_capacity);
  local_618 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x44;
  file_15.m_begin = (iterator)&local_618;
  msg_15.m_end = pvVar4;
  msg_15.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_628,
             msg_15);
  ser_readdata8<AutoFile>(&local_108);
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_630 = "";
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x44;
  file_16.m_begin = (iterator)&local_638;
  msg_16.m_end = pvVar4;
  msg_16.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_648,
             msg_16);
  local_c8._M_dataplus._M_p._0_1_ = 0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011482f0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "exception std::ios_base::failure expected but not raised";
  local_658 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_650 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_c8,&local_a8,1,1,WARN,(check_type)psVar5,(size_t)&local_658,
             0x44);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_c8.field_2._M_allocated_capacity);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  AutoFile::~AutoFile(&local_108);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&xor_pat.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&test2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&test1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::filesystem::__cxx11::path::~path(&xor_path.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(xor_file)
{
    fs::path xor_path{m_args.GetDataDirBase() / "test_xor.bin"};
    auto raw_file{[&](const auto& mode) { return fsbridge::fopen(xor_path, mode); }};
    const std::vector<uint8_t> test1{1, 2, 3};
    const std::vector<uint8_t> test2{4, 5};
    const std::vector<std::byte> xor_pat{std::byte{0xff}, std::byte{0x00}};
    {
        // Check errors for missing file
        AutoFile xor_file{raw_file("rb"), xor_pat};
        BOOST_CHECK_EXCEPTION(xor_file << std::byte{}, std::ios_base::failure, HasReason{"AutoFile::write: file handle is nullpt"});
        BOOST_CHECK_EXCEPTION(xor_file >> std::byte{}, std::ios_base::failure, HasReason{"AutoFile::read: file handle is nullpt"});
        BOOST_CHECK_EXCEPTION(xor_file.ignore(1), std::ios_base::failure, HasReason{"AutoFile::ignore: file handle is nullpt"});
    }
    {
#ifdef __MINGW64__
        // Temporary workaround for https://github.com/bitcoin/bitcoin/issues/30210
        const char* mode = "wb";
#else
        const char* mode = "wbx";
#endif
        AutoFile xor_file{raw_file(mode), xor_pat};
        xor_file << test1 << test2;
    }
    {
        // Read raw from disk
        AutoFile non_xor_file{raw_file("rb")};
        std::vector<std::byte> raw(7);
        non_xor_file >> Span{raw};
        BOOST_CHECK_EQUAL(HexStr(raw), "fc01fd03fd04fa");
        // Check that no padding exists
        BOOST_CHECK_EXCEPTION(non_xor_file.ignore(1), std::ios_base::failure, HasReason{"AutoFile::ignore: end of file"});
    }
    {
        AutoFile xor_file{raw_file("rb"), xor_pat};
        std::vector<std::byte> read1, read2;
        xor_file >> read1 >> read2;
        BOOST_CHECK_EQUAL(HexStr(read1), HexStr(test1));
        BOOST_CHECK_EQUAL(HexStr(read2), HexStr(test2));
        // Check that eof was reached
        BOOST_CHECK_EXCEPTION(xor_file >> std::byte{}, std::ios_base::failure, HasReason{"AutoFile::read: end of file"});
    }
    {
        AutoFile xor_file{raw_file("rb"), xor_pat};
        std::vector<std::byte> read2;
        // Check that ignore works
        xor_file.ignore(4);
        xor_file >> read2;
        BOOST_CHECK_EQUAL(HexStr(read2), HexStr(test2));
        // Check that ignore and read fail now
        BOOST_CHECK_EXCEPTION(xor_file.ignore(1), std::ios_base::failure, HasReason{"AutoFile::ignore: end of file"});
        BOOST_CHECK_EXCEPTION(xor_file >> std::byte{}, std::ios_base::failure, HasReason{"AutoFile::read: end of file"});
    }
}